

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O1

void __thiscall QPDFObjectHandle::pipePageContents(QPDFObjectHandle *this,Pipeline *p)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  element_type *peVar2;
  long *plVar3;
  size_type *psVar4;
  string all_description;
  string description;
  string local_98;
  string local_78;
  QPDFObjGen local_58 [2];
  long local_48 [2];
  QPDFObjectHandle local_38;
  
  peVar2 = (this->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar2 == (element_type *)0x0) {
    local_58[0].obj = 0;
    local_58[0].gen = 0;
  }
  else {
    local_58[0] = peVar2->og;
  }
  QPDFObjGen::unparse_abi_cxx11_(&local_98,local_58,' ');
  plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,0x285d79);
  psVar4 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_78.field_2._M_allocated_capacity = *psVar4;
    local_78.field_2._8_8_ = plVar3[3];
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  }
  else {
    local_78.field_2._M_allocated_capacity = *psVar4;
    local_78._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_78._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  paVar1 = &local_98.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                             local_98.field_2._M_local_buf[0]) + 1);
  }
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  local_98._M_dataplus._M_p = (pointer)paVar1;
  local_58[0] = (QPDFObjGen)local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"/Contents","");
  getKey(&local_38,(string *)this);
  pipeContentStreams(&local_38,p,&local_78,&local_98);
  if (local_38.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_58[0] != (QPDFObjGen)local_48) {
    operator_delete((void *)local_58[0],local_48[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                             local_98.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
QPDFObjectHandle::pipePageContents(Pipeline* p)
{
    std::string description = "page object " + getObjGen().unparse(' ');
    std::string all_description;
    this->getKey("/Contents").pipeContentStreams(p, description, all_description);
}